

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O1

void __thiscall OSSLRSAPrivateKey::setFromOSSL(OSSLRSAPrivateKey *this,RSA *inRSA)

{
  ByteString inP;
  BIGNUM *bn_e;
  BIGNUM *bn_n;
  BIGNUM *bn_d;
  BIGNUM *bn_iqmp;
  BIGNUM *bn_dmq1;
  BIGNUM *bn_dmp1;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  ByteString local_98;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  local_38 = (BIGNUM *)0x0;
  local_40 = (BIGNUM *)0x0;
  local_48 = (BIGNUM *)0x0;
  local_50 = (BIGNUM *)0x0;
  local_58 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  local_70 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  RSA_get0_factors(inRSA,&local_38);
  RSA_get0_crt_params(inRSA,&local_48,&local_50,&local_58);
  RSA_get0_key(inRSA,&local_68,&local_70,&local_60);
  if (local_38 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_38);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x40))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_40 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_40);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x48))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_48 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_48);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x58))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_50 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_50);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x60))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_58 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_58);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x50))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_68 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_68);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x70))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_70 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_70);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x78))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_60 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_98,local_60);
    (**(code **)(*(long *)&this->super_RSAPrivateKey + 0x68))(this,&local_98);
    local_98._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_98.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void OSSLRSAPrivateKey::setFromOSSL(const RSA* inRSA)
{
	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_dmp1 = NULL;
	const BIGNUM* bn_dmq1 = NULL;
	const BIGNUM* bn_iqmp = NULL;
	const BIGNUM* bn_n = NULL;
	const BIGNUM* bn_e = NULL;
	const BIGNUM* bn_d = NULL;

	RSA_get0_factors(inRSA, &bn_p, &bn_q);
	RSA_get0_crt_params(inRSA, &bn_dmp1, &bn_dmq1, &bn_iqmp);
	RSA_get0_key(inRSA, &bn_n, &bn_e, &bn_d);

	if (bn_p)
	{
		ByteString inP = OSSL::bn2ByteString(bn_p);
		setP(inP);
	}
	if (bn_q)
	{
		ByteString inQ = OSSL::bn2ByteString(bn_q);
		setQ(inQ);
	}
	if (bn_dmp1)
	{
		ByteString inDP1 = OSSL::bn2ByteString(bn_dmp1);
		setDP1(inDP1);
	}
	if (bn_dmq1)
	{
		ByteString inDQ1 = OSSL::bn2ByteString(bn_dmq1);
		setDQ1(inDQ1);
	}
	if (bn_iqmp)
	{
		ByteString inPQ = OSSL::bn2ByteString(bn_iqmp);
		setPQ(inPQ);
	}
	if (bn_n)
	{
		ByteString inN = OSSL::bn2ByteString(bn_n);
		setN(inN);
	}
	if (bn_e)
	{
		ByteString inE = OSSL::bn2ByteString(bn_e);
		setE(inE);
	}
	if (bn_d)
	{
		ByteString inD = OSSL::bn2ByteString(bn_d);
		setD(inD);
	}
}